

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::
matchValue<std::shared_ptr<mathiu::impl::Expr_const>>
          (Id<std::shared_ptr<mathiu::impl::Expr_const>> *this,
          shared_ptr<const_mathiu::impl::Expr> *v)

{
  bool bVar1;
  shared_ptr<const_mathiu::impl::Expr> *lhs;
  IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_> *this_00;
  ValueVariant<std::shared_ptr<const_mathiu::impl::Expr>_> *pVVar2;
  shared_ptr<const_mathiu::impl::Expr> *v_local;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *this_local;
  
  bVar1 = Id<std::shared_ptr<const_mathiu::impl::Expr>_>::hasValue
                    ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this);
  if (bVar1) {
    lhs = Id<std::shared_ptr<const_mathiu::impl::Expr>_>::internalValue
                    ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this);
    this_local._7_1_ = IdTraits<std::shared_ptr<const_mathiu::impl::Expr>_>::equal(lhs,v);
  }
  else {
    this_00 = &Id<std::shared_ptr<const_mathiu::impl::Expr>_>::block
                         ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this)->
               super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
    pVVar2 = IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::variant(this_00);
    IdUtil<std::shared_ptr<mathiu::impl::Expr_const>>::
    bindValue<std::shared_ptr<mathiu::impl::Expr_const>>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }